

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void cleanup_ui_knowledge_parsed_data(void)

{
  long lVar1;
  long lVar2;
  
  if (L'\0' < n_monster_group) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      string_free(*(char **)(monster_group->inc_flags + lVar1 + -0x10));
      mem_free(*(void **)(monster_group->inc_flags + lVar1 + -8));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x30;
    } while (lVar2 < n_monster_group);
  }
  mem_free(monster_group);
  monster_group = (ui_monster_category *)0x0;
  n_monster_group = L'\0';
  return;
}

Assistant:

static void cleanup_ui_knowledge_parsed_data(void)
{
	int i;

	for (i = 0; i < n_monster_group; ++i) {
		string_free((char*) monster_group[i].name);
		mem_free(monster_group[i].inc_bases);
	}
	mem_free(monster_group);
	monster_group = NULL;
	n_monster_group = 0;
}